

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall wabt::interp::Thread::DoTableSet(Thread *this,Instr instr,Ptr *out_trap)

{
  Store *this_00;
  Result RVar1;
  RunResult RVar2;
  Value VVar3;
  Value VVar4;
  RefPtr<wabt::interp::Table> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  RefPtr<wabt::interp::Trap> local_48;
  
  RefPtr<wabt::interp::Table>::RefPtr
            (&local_80,this->store_,
             (Ref)(this->inst_->tables_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  VVar3 = Pop(this);
  VVar4 = Pop(this);
  RVar1 = Table::Set(local_80.obj_,this->store_,VVar4.field_0.i32_,VVar3.field_0.ref_.index);
  RVar2 = Ok;
  if (RVar1.enum_ == Error) {
    this_00 = this->store_;
    StringPrintf_abi_cxx11_
              (&local_68,"out of bounds table access: table.set at %u >= max value %u",
               VVar4.field_0.i64_ & 0xffffffff,
               (ulong)((long)((local_80.obj_)->elements_).
                             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)((local_80.obj_)->elements_).
                            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3);
    Store::
    Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
              (&local_48,this_00,this_00,&local_68,&this->frames_);
    out_trap->obj_ = local_48.obj_;
    out_trap->store_ = local_48.store_;
    out_trap->root_index_ = local_48.root_index_;
    local_48.obj_ = (Trap *)0x0;
    local_48.store_ = (Store *)0x0;
    local_48.root_index_ = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    RVar2 = Trap;
  }
  if (local_80.obj_ != (Table *)0x0) {
    Store::DeleteRoot(local_80.store_,local_80.root_index_);
  }
  return RVar2;
}

Assistant:

RunResult Thread::DoTableSet(Instr instr, Trap::Ptr* out_trap) {
  Table::Ptr table{store_, inst_->tables()[instr.imm_u32]};
  auto ref = Pop<Ref>();
  auto index = Pop<u32>();
  TRAP_IF(Failed(table->Set(store_, index, ref)),
          StringPrintf(
              "out of bounds table access: table.set at %u >= max value %u",
              index, table->size()));
  return RunResult::Ok;
}